

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# move.cpp
# Opt level: O2

void next_move(Node *root,int depth)

{
  char cVar1;
  int iVar2;
  Node ptVar3;
  bool bVar4;
  long lVar5;
  long lVar6;
  int row;
  long lVar7;
  pointer root_00;
  
  if (depth < 3) {
    lVar6 = 0x1a;
    for (lVar7 = 2; lVar7 != 10; lVar7 = lVar7 + 1) {
      for (lVar5 = 0; lVar5 != 8; lVar5 = lVar5 + 1) {
        cVar1 = (*root)->board[0][lVar5 + lVar6];
        row = (int)lVar7;
        iVar2 = (int)lVar5;
        if ((*root)->cur_side == false) {
          switch(cVar1) {
          case 'k':
            bVar4 = true;
            goto LAB_00103b90;
          case 'l':
          case 'm':
          case 'o':
            break;
          case 'n':
            bVar4 = true;
            goto LAB_00103c2e;
          case 'p':
            bVar4 = true;
            goto LAB_00103c1b;
          case 'q':
            bVar4 = true;
            goto LAB_00103c41;
          case 'r':
            bVar4 = true;
            goto LAB_00103c08;
          default:
            if (cVar1 == 'b') {
              bVar4 = true;
              goto LAB_00103bf5;
            }
          }
        }
        else {
          switch(cVar1) {
          case 'K':
            bVar4 = false;
LAB_00103b90:
            king(root,row,iVar2 + 2,bVar4);
            break;
          case 'L':
          case 'M':
          case 'O':
            break;
          case 'N':
            bVar4 = false;
LAB_00103c2e:
            knight(root,row,iVar2 + 2,bVar4);
            break;
          case 'P':
            bVar4 = false;
LAB_00103c1b:
            pawn(root,row,iVar2 + 2,bVar4);
            break;
          case 'Q':
            bVar4 = false;
LAB_00103c41:
            queen(root,row,iVar2 + 2,bVar4);
            break;
          case 'R':
            bVar4 = false;
LAB_00103c08:
            rook(root,row,iVar2 + 2,bVar4);
            break;
          default:
            if (cVar1 == 'B') {
              bVar4 = false;
LAB_00103bf5:
              bishop(root,row,iVar2 + 2,bVar4);
            }
          }
        }
      }
      lVar6 = lVar6 + 0xc;
    }
    ptVar3 = *root;
    for (root_00 = (ptVar3->next).super__Vector_base<tNode_*,_std::allocator<tNode_*>_>._M_impl.
                   super__Vector_impl_data._M_start;
        root_00 !=
        (ptVar3->next).super__Vector_base<tNode_*,_std::allocator<tNode_*>_>._M_impl.
        super__Vector_impl_data._M_finish; root_00 = root_00 + 1) {
      next_move(root_00,depth + 1);
      ptVar3 = *root;
    }
  }
  return;
}

Assistant:

void next_move(Node& root, int depth){
    if(depth >= MAX_DEPTH)
        return;

    int i, j;
    for(i=2; i<10; i++){
        for(j=2; j<10; j++){
            char c = root->board[i][j];

            if(0 == root->cur_side){ // WHITE has moved. Looking for BLACK pieces to move
                switch(c){
                    case 'q': queen(root, i, j, 1); break;
                    case 'r': rook(root, i, j, 1); break;
                    case 'b': bishop(root, i, j, 1); break;
                    case 'n': knight(root, i, j, 1); break;
                    case 'p': pawn(root, i, j, 1); break;
                    case 'k': king(root, i, j, 1); break;
                }
            }
            else{ // BLACK has moved. Looking for WHITE pieces to move.
                switch(c){
                    case 'Q': queen(root, i, j, 0); break;
                    case 'R': rook(root, i, j, 0); break;
                    case 'B': bishop(root, i, j, 0); break;
                    case 'N': knight(root, i, j, 0); break;
                    case 'P': pawn(root, i, j, 0); break;
                    case 'K': king(root, i, j, 0); break;
                }
            }
        }
    }
    // Iterates through each of the generated possibilities
    vector<Node>::iterator it;
    for(it=root->next.begin(); it!=root->next.end(); it++)
        next_move(*it, depth+1);
}